

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassCache.hpp
# Opt level: O0

size_t __thiscall Diligent::RenderPassCache::RenderPassCacheKey::GetHash(RenderPassCacheKey *this)

{
  size_t sVar1;
  uint local_14;
  Uint32 rt;
  RenderPassCacheKey *this_local;
  
  if (this->Hash == 0) {
    sVar1 = ComputeHash<unsigned_char,unsigned_char,Diligent::TEXTURE_FORMAT,bool,bool>
                      (&this->NumRenderTargets,&this->SampleCount,&this->DSVFormat,&this->EnableVRS,
                       &this->ReadOnlyDSV);
    this->Hash = sVar1;
    for (local_14 = 0; local_14 < this->NumRenderTargets; local_14 = local_14 + 1) {
      HashCombine<Diligent::TEXTURE_FORMAT>(&this->Hash,this->RTVFormats + local_14);
    }
  }
  return this->Hash;
}

Assistant:

size_t GetHash() const noexcept
        {
            if (Hash == 0)
            {
                Hash = ComputeHash(NumRenderTargets, SampleCount, DSVFormat, EnableVRS, ReadOnlyDSV);
                for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
                    HashCombine(Hash, RTVFormats[rt]);
            }
            return Hash;
        }